

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void __thiscall IrSim::buildActive(IrSim *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  Operand *in_RDI;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  *unaff_retaddr;
  int kind;
  int k;
  int j;
  int i;
  int size;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  int local_18;
  int local_10;
  Operand *__new_size;
  
  __new_size = in_RDI;
  sVar2 = std::
          vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ::size((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)&in_RDI[6].field_0x18);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  ::clear((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
           *)0x1105c2);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  ::resize(unaff_retaddr,(size_type)__new_size);
  for (local_10 = 0; local_10 < (int)sVar2; local_10 = local_10 + 1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)0x1105fd);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_10);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)(local_10 + 1));
    local_18 = *pvVar3;
    while (local_18 = local_18 + -1, iVar1 <= local_18) {
      pvVar4 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                         ((vector<InterCode,_std::allocator<InterCode>_> *)&in_RDI[2].field_0x20,
                          (long)local_18);
      iVar5 = pvVar4->kind;
      if ((iVar5 < 9) || (0x13 < iVar5)) {
        if (iVar5 == 8) {
          std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                    ((vector<InterCode,_std::allocator<InterCode>_> *)&in_RDI[2].field_0x20,
                     (long)local_18);
          InterCode::operator[]
                    ((InterCode *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20));
          setUsage((IrSim *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),in_RDI,0,0x1106e1);
        }
        else {
          std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                    ((vector<InterCode,_std::allocator<InterCode>_> *)&in_RDI[2].field_0x20,
                     (long)local_18);
          InterCode::operator[]
                    ((InterCode *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20));
          unsetUsage((IrSim *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),in_RDI,0);
        }
        std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                  ((vector<InterCode,_std::allocator<InterCode>_> *)&in_RDI[2].field_0x20,
                   (long)local_18);
        InterCode::operator[]
                  ((InterCode *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_RDI >> 0x20));
        setUsage((IrSim *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),in_RDI,0,0x110717);
        std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                  ((vector<InterCode,_std::allocator<InterCode>_> *)&in_RDI[2].field_0x20,
                   (long)local_18);
        InterCode::operator[]
                  ((InterCode *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_RDI >> 0x20));
        setUsage((IrSim *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),in_RDI,0,0x11074d);
      }
      else if ((((iVar5 == 0x13) || (iVar5 == 9)) || (iVar5 == 10)) ||
              ((iVar5 == 0xb || (iVar5 == 0xc)))) {
        std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                  ((vector<InterCode,_std::allocator<InterCode>_> *)&in_RDI[2].field_0x20,
                   (long)local_18);
        InterCode::operator[]
                  ((InterCode *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_RDI >> 0x20));
        setUsage((IrSim *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),in_RDI,0,0x1107a5);
      }
    }
  }
  return;
}

Assistant:

void IrSim::buildActive() {
    int size = (int)edges.size();
    use.clear();
//    lastUsages.clear();
    use.resize((size_t)size);
    for (int i = 0; i < size; ++i) {
        lastUsages.clear();
        for (int j = (int) basicBlocks[i], k = (int) basicBlocks[i + 1] - 1; k >= j; --k) {
            int kind = irList[k].kind;
            if (kind < IC_NONVAR || kind > IC_NONVAR_LAST) {
                if (kind != IC_DEREF_L)
                    unsetUsage(irList[k][0], i);
                else
                    setUsage(irList[k][0], i, k);
                setUsage(irList[k][1], i, k);
                setUsage(irList[k][2], i ,k);
            }
            else if (kind == IC_WRITE || kind == IC_ARG || kind == IC_ARGADDR || kind == IC_RETURN || kind == IC_CALL) {
                setUsage(irList[k][0], i, k);
            }
        }
    }
}